

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O1

unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> __thiscall
pfederc::Parser::parseFunctionBody(Parser *this)

{
  Position *this_00;
  TokenType TVar1;
  Token *pTVar2;
  pointer pcVar3;
  size_t sVar4;
  istream *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined7 extraout_var;
  Lexer *pLVar9;
  undefined7 extraout_var_00;
  Lexer *pLVar10;
  pointer *__ptr;
  Parser *in_RSI;
  uint uVar11;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> returnExpr;
  Position pos;
  Exprs exprs;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  _Alloc_hider _Stack_60;
  _Base_ptr local_58;
  unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> local_50;
  Exprs local_48;
  
  pTVar2 = in_RSI->lexer->currentToken;
  local_78._16_8_ = (pTVar2->pos).line;
  this_00 = (Position *)(local_78 + 0x10);
  _Stack_60._M_p = (pointer)(pTVar2->pos).startIndex;
  local_58 = (_Base_ptr)(pTVar2->pos).endIndex;
  local_48.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar9 = this->lexer;
  uVar11 = 0;
LAB_0011659c:
  do {
    bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_RET);
    if ((((!bVar8) || (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT), !bVar8)) ||
        (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), !bVar8)) ||
       (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_KW_ELSE), !bVar8)) {
      this->lexer = pLVar9;
      local_98._0_8_ = (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0;
      bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_RET);
      if (((bVar8) || (bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_CTN), bVar8)) ||
         (bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_KW_BRK), bVar8)) {
        TVar1 = in_RSI->lexer->currentToken->type;
        if (TVar1 == TOK_KW_RET) {
          local_98._8_4_ = RETURN;
          bVar8 = true;
        }
        else {
          if (TVar1 == TOK_KW_BRK) {
            local_98._8_4_ = BREAK;
          }
          else {
            if (TVar1 != TOK_KW_CTN) {
              local_88._0_8_ = (Lexer *)local_78;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_88,"Return control is neither ret, ctn or brk.","");
              fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_func.cpp"
                    ,0x163,(string *)local_88);
              if ((Lexer *)local_88._0_8_ != (Lexer *)local_78) {
                operator_delete((void *)local_88._0_8_,(ulong)(local_78._0_8_ + 1));
              }
              bVar8 = false;
              local_98._8_4_ = NONE;
              goto LAB_00116901;
            }
            local_98._8_4_ = CONTINUE;
          }
          bVar8 = false;
        }
LAB_00116901:
        Position::operator+((Position *)local_88,(Position *)(local_78 + 0x10),
                            &in_RSI->lexer->currentToken->pos);
        local_58 = (_Base_ptr)local_78._0_8_;
        local_78._16_8_ = local_88._0_8_;
        _Stack_60._M_p = (pointer)local_88._8_8_;
        Lexer::next(in_RSI->lexer);
        if ((bVar8) ||
           (((bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOF), bVar8 &&
             (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOL), bVar8)) &&
            (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT), bVar8)))) {
          parseExpression((Parser *)local_88,(Precedence)in_RSI);
          uVar7 = local_88._0_8_;
          uVar6 = local_98._0_8_;
          local_88._0_8_ = (Lexer *)0x0;
          local_98._0_8_ = uVar7;
          if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)uVar6 !=
              (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
            (**(code **)(*(long *)uVar6 + 8))();
          }
          if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
            (**(code **)(*(long *)local_88._0_8_ + 8))();
          }
          if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_98._0_8_
              == (Expr *)0x0) {
            uVar11 = 1;
          }
          else {
            Position::operator+((Position *)local_88,(Position *)(local_78 + 0x10),
                                (Position *)(local_98._0_8_ + 0x20));
            local_58 = (_Base_ptr)local_78._0_8_;
            local_78._16_8_ = local_88._0_8_;
            _Stack_60._M_p = (pointer)local_88._8_8_;
          }
        }
      }
      else {
        local_98._8_4_ = NONE;
      }
      skipEol(in_RSI);
      if ((uVar11 & 1) == 0) {
        pLVar9 = in_RSI->lexer;
        pLVar10 = (Lexer *)operator_new(0x60);
        BodyExpr::BodyExpr((BodyExpr *)pLVar10,pLVar9,(Position *)(local_78 + 0x10),&local_48,
                           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           local_98,local_98._8_4_);
      }
      else {
        this->lexer = (Lexer *)0x0;
        pLVar10 = (Lexer *)0x0;
      }
      this->lexer = pLVar10;
      if ((Lexer *)local_98._0_8_ != (Lexer *)0x0) {
        (*(*(_func_int ***)local_98._0_8_)[1])();
      }
      goto LAB_00116a6f;
    }
    bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_EOL);
    if (!bVar8) break;
    Lexer::next(in_RSI->lexer);
  } while( true );
  parseExpression((Parser *)local_98,(Precedence)in_RSI);
  bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_STMT);
  if ((bVar8) && (bVar8 = Token::operator!=(in_RSI->lexer->currentToken,TOK_EOL), bVar8)) {
    pTVar2 = in_RSI->lexer->currentToken;
    local_88._0_8_ = operator_new(0x38);
    sVar4 = (pTVar2->pos).line;
    piVar5 = (istream *)(pTVar2->pos).startIndex;
    pcVar3 = (pointer)(pTVar2->pos).endIndex;
    *(Level *)&((Lexer *)local_88._0_8_)->_vptr_Lexer = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((Lexer *)local_88._0_8_)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL;
    ((Position *)&((Lexer *)local_88._0_8_)->cfg)->line = sVar4;
    ((Lexer *)local_88._0_8_)->input = piVar5;
    (((Lexer *)local_88._0_8_)->filePath)._M_dataplus._M_p = pcVar3;
    (((Lexer *)local_88._0_8_)->filePath)._M_string_length = 0;
    (((Lexer *)local_88._0_8_)->filePath).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(((Lexer *)local_88._0_8_)->filePath).field_2 + 8) = 0;
    generateError((Parser *)(local_78 + 0x28),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_78 + 0x28));
    if ((Lexer *)local_88._0_8_ != (Lexer *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_88,
                 (Error<pfederc::SyntaxErrorCode> *)local_88._0_8_);
    }
    skipToStmtEol(in_RSI);
    local_98._12_4_ = (uint)CONCAT71(extraout_var,1);
LAB_00116788:
    expect(in_RSI,TOK_EOL);
    if ((Expr *)local_98._0_8_ == (Expr *)0x0) {
      local_98._12_4_ = (undefined4)CONCAT71(extraout_var_00,1);
    }
    else {
      Position::operator+((Position *)local_88,this_00,(Position *)(local_98._0_8_ + 0x20));
      local_58 = (_Base_ptr)local_78._0_8_;
      local_78._16_8_ = local_88._0_8_;
      _Stack_60._M_p = (pointer)local_88._8_8_;
      std::
      vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
      ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                ((vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                  *)&local_48,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_98);
    }
    bVar8 = true;
  }
  else {
    bVar8 = Token::operator==(in_RSI->lexer->currentToken,TOK_STMT);
    local_98._12_4_ = uVar11;
    if ((!bVar8) || ((Lexer *)local_98._0_8_ == (Lexer *)0x0)) goto LAB_00116788;
    Position::operator+((Position *)local_88,this_00,(Position *)(local_98._0_8_ + 0x20));
    local_58 = (_Base_ptr)local_78._0_8_;
    local_78._16_8_ = local_88._0_8_;
    _Stack_60._M_p = (pointer)local_88._8_8_;
    pLVar10 = in_RSI->lexer;
    pLVar9 = (Lexer *)operator_new(0x60);
    BodyExpr::BodyExpr((BodyExpr *)pLVar9,pLVar10,this_00,&local_48,
                       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_98,
                       RETURN);
    bVar8 = false;
  }
  if ((Expr *)local_98._0_8_ != (Expr *)0x0) {
    (**(code **)(*(long *)local_98._0_8_ + 8))();
  }
  uVar11 = local_98._12_4_;
  if (!bVar8) {
    this->lexer = pLVar9;
LAB_00116a6f:
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector(&local_48);
    return (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
           (__uniq_ptr_data<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>,_true,_true>)
           this;
  }
  goto LAB_0011659c;
}

Assistant:

std::unique_ptr<BodyExpr> Parser::parseFunctionBody() noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  bool err = false;
  Exprs exprs;
  while (*lexer.getCurrentToken() != TokenType::TOK_KW_RET
      && *lexer.getCurrentToken() != TokenType::TOK_STMT
      && *lexer.getCurrentToken() != TokenType::TOK_EOF
      && *lexer.getCurrentToken() != TokenType::TOK_KW_ELSE) {
    if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next();
      continue;
    }

    std::unique_ptr<Expr> expr(parseExpression());
    if (*lexer.getCurrentToken() != TokenType::TOK_STMT
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      skipToStmtEol();
      err = true;
    } else if (*lexer.getCurrentToken() == TokenType::TOK_STMT && expr) {
      pos = pos + expr->getPosition();
      // return expression without mentioning return ('expr' ';')
      return std::make_unique<BodyExpr>(lexer, pos,
          std::move(exprs), std::move(expr),
          ReturnControlType::RETURN);
    }

    expect(TokenType::TOK_EOL);

    if (!expr)
      err = true;
    else {
      pos = pos + expr->getPosition();
      exprs.push_back(std::move(expr));
    }
  }

  std::unique_ptr<Expr> returnExpr;
  ReturnControlType rct{ReturnControlType::NONE};
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_RET
      || *lexer.getCurrentToken() == TokenType::TOK_KW_CTN
      || *lexer.getCurrentToken() == TokenType::TOK_KW_BRK) {
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_KW_RET:
      rct = ReturnControlType::RETURN;
      break;
    case TokenType::TOK_KW_CTN:
      rct = ReturnControlType::CONTINUE;
      break;
    case TokenType::TOK_KW_BRK:
      rct = ReturnControlType::BREAK;
      break;
    default:
      fatal(__FILE__, __LINE__, "Return control is neither ret, ctn or brk.");
      break;
    }

    pos = pos + lexer.getCurrentToken()->getPosition();
    lexer.next(); // eat return,ctn,brk

    if (rct == ReturnControlType::RETURN
        || (*lexer.getCurrentToken() != TokenType::TOK_EOF
            && *lexer.getCurrentToken() != TokenType::TOK_EOL
            && *lexer.getCurrentToken() != TokenType::TOK_STMT)) {
      returnExpr = parseExpression();
      if (returnExpr)
        pos = pos + returnExpr->getPosition();
      else
        err = true;
    }
  }

  skipEol();

  if (err)
    return nullptr;

  return std::make_unique<BodyExpr>(lexer,
    pos, std::move(exprs), std::move(returnExpr), rct);
}